

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

void ffxmsg(int action,char *errmsg)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  
  pcVar7 = ffxmsg::txtbuff[0];
  pcVar2 = ffxmsg::msgptr;
  iVar10 = ffxmsg::nummsg;
  switch(action) {
  case 1:
    if (0 < (long)ffxmsg::nummsg) {
      lVar5 = 0;
      do {
        **(undefined1 **)((long)ffxmsg::txtbuff + lVar5) = 0;
        lVar5 = lVar5 + 8;
      } while ((long)ffxmsg::nummsg * 8 != lVar5);
    }
    ffxmsg::nummsg = 0;
    pcVar2 = ffxmsg::msgptr;
    iVar10 = ffxmsg::nummsg;
    break;
  case 2:
    uVar4 = (ulong)ffxmsg::nummsg;
    if ((long)uVar4 < 1) {
      return;
    }
    do {
      uVar9 = uVar4 - 1;
      cVar1 = **(char **)(&DAT_00383898 + uVar4 * 8);
      **(char **)(&DAT_00383898 + uVar4 * 8) = '\0';
      if (uVar4 < 2) break;
      uVar4 = uVar9;
    } while (cVar1 != '\x1b');
    goto LAB_0017aff8;
  case 3:
    if (0 < ffxmsg::nummsg) {
      ffxmsg::nummsg = ffxmsg::nummsg - 1;
      *ffxmsg::txtbuff[(uint)ffxmsg::nummsg] = '\0';
      pcVar2 = ffxmsg::msgptr;
      iVar10 = ffxmsg::nummsg;
    }
    break;
  case 4:
    uVar9 = (ulong)(uint)(~(ffxmsg::nummsg >> 0x1f) & ffxmsg::nummsg);
    uVar8 = ffxmsg::nummsg;
    do {
      pcVar7 = ffxmsg::txtbuff[0];
      uVar8 = uVar8 - 1;
      bVar11 = uVar9 == 0;
      uVar9 = uVar9 - 1;
      if (bVar11) {
        *errmsg = '\0';
        return;
      }
      strcpy(errmsg,ffxmsg::txtbuff[0]);
      *pcVar7 = '\0';
      ffxmsg::nummsg = uVar8;
      if (uVar8 != 0) {
        memmove(ffxmsg::txtbuff,ffxmsg::txtbuff + 1,(ulong)uVar8 << 3);
      }
      pcVar2 = ffxmsg::msgptr;
      iVar10 = ffxmsg::nummsg;
    } while (*errmsg == '\x1b');
    break;
  case 5:
    cVar1 = *errmsg;
    while (ffxmsg::txtbuff[0] = pcVar7, pcVar2 = errmsg, cVar1 != '\0') {
      if (iVar10 == 0x19) {
        ffxmsg::tmpbuff = pcVar7;
        *pcVar7 = '\0';
        memmove(ffxmsg::txtbuff,ffxmsg::txtbuff + 1,0xc0);
        iVar10 = 0x18;
        ffxmsg::txtbuff[0x18] = pcVar7;
      }
      else {
        lVar5 = 0;
        do {
          if (ffxmsg::errbuff[0][lVar5] == '\0') {
            pcVar7 = ffxmsg::errbuff[0] + lVar5;
            ffxmsg::txtbuff[iVar10] = pcVar7;
            goto LAB_0017ae57;
          }
          lVar5 = lVar5 + 0x51;
        } while (lVar5 != 0x7e9);
        pcVar7 = ffxmsg::txtbuff[iVar10];
      }
LAB_0017ae57:
      strncat(pcVar7,errmsg,0x50);
      iVar10 = iVar10 + 1;
      sVar3 = strlen(errmsg);
      if (0x4f < sVar3) {
        sVar3 = 0x50;
      }
      cVar1 = errmsg[sVar3];
      errmsg = errmsg + sVar3;
      pcVar7 = ffxmsg::txtbuff[0];
    }
    break;
  case 6:
    lVar5 = (long)ffxmsg::nummsg;
    if (lVar5 == 0x19) {
      ffxmsg::tmpbuff = ffxmsg::txtbuff[0];
      *ffxmsg::txtbuff[0] = '\0';
      memmove(ffxmsg::txtbuff,ffxmsg::txtbuff + 1,0xc0);
      ffxmsg::txtbuff[0x18] = pcVar7;
      ffxmsg::nummsg = 0x18;
    }
    else {
      lVar6 = 0;
      do {
        if (ffxmsg::errbuff[0][lVar6] == '\0') {
          pcVar7 = ffxmsg::errbuff[0] + lVar6;
          ffxmsg::txtbuff[lVar5] = pcVar7;
          goto LAB_0017aff1;
        }
        lVar6 = lVar6 + 0x51;
      } while (lVar6 != 0x7e9);
      pcVar7 = ffxmsg::txtbuff[lVar5];
    }
LAB_0017aff1:
    pcVar7[0] = '\x1b';
    pcVar7[1] = '\0';
    uVar9 = (ulong)(ffxmsg::nummsg + 1);
LAB_0017aff8:
    pcVar2 = ffxmsg::msgptr;
    iVar10 = (int)uVar9;
  }
  ffxmsg::nummsg = iVar10;
  ffxmsg::msgptr = pcVar2;
  return;
}

Assistant:

void ffxmsg( int action,
            char *errmsg)
/*
  general routine to get, put, or clear the error message stack.
  Use a static array rather than allocating memory as needed for
  the error messages because it is likely to be more efficient
  and simpler to implement.

  Action Code:
DelAll     1  delete all messages on the error stack 
DelMark    2  delete messages back to and including the 1st marker 
DelNewest  3  delete the newest message from the stack 
GetMesg    4  pop and return oldest message, ignoring marks 
PutMesg    5  add a new message to the stack 
PutMark    6  add a marker to the stack 

*/
{
    int ii;
    char markflag;
    static char *txtbuff[errmsgsiz], *tmpbuff, *msgptr;
    static char errbuff[errmsgsiz][81];  /* initialize all = \0 */
    static int nummsg = 0;

    FFLOCK;
    
    if (action == DelAll)  /* clear the whole message stack */
    {
      for (ii = 0; ii < nummsg; ii ++)
        *txtbuff[ii] = '\0';

      nummsg = 0;
    }
    else if (action == DelMark)  /* clear up to and including first marker */
    {
      while (nummsg > 0) {
        nummsg--;  
        markflag = *txtbuff[nummsg]; /* store possible marker character */
        *txtbuff[nummsg] = '\0';  /* clear the buffer for this msg */

        if (markflag == ESMARKER)
           break;   /* found a marker, so quit */
      }
    }
    else if (action == DelNewest)  /* remove newest message from stack */ 
    {
      if (nummsg > 0)
      {
        nummsg--;  
        *txtbuff[nummsg] = '\0';  /* clear the buffer for this msg */
      }
    }
    else if (action == GetMesg)  /* pop and return oldest message from stack */ 
    {                            /* ignoring markers */
      while (nummsg > 0)
      {
         strcpy(errmsg, txtbuff[0]);   /* copy oldest message to output */

         *txtbuff[0] = '\0';  /* clear the buffer for this msg */
           
         nummsg--;  
         for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1]; /* shift remaining pointers */

         if (errmsg[0] != ESMARKER) {   /* quit if this is not a marker */
            FFUNLOCK;
            return;
         }
       }
       errmsg[0] = '\0';  /*  no messages in the stack */
    }
    else if (action == PutMesg)  /* add new message to stack */
    {
     msgptr = errmsg;
     while (strlen(msgptr))
     {
      if (nummsg == errmsgsiz)
      {
        tmpbuff = txtbuff[0];  /* buffers full; reuse oldest buffer */
        *txtbuff[0] = '\0';  /* clear the buffer for this msg */

        nummsg--;
        for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1];   /* shift remaining pointers */

        txtbuff[nummsg] = tmpbuff;  /* set pointer for the new message */
      }
      else
      {
        for (ii = 0; ii < errmsgsiz; ii++)
        {
          if (*errbuff[ii] == '\0') /* find first empty buffer */
          {
            txtbuff[nummsg] = errbuff[ii];
            break;
          }
        }
      }

      strncat(txtbuff[nummsg], msgptr, 80);
      nummsg++;

      msgptr += minvalue(80, strlen(msgptr));
     }
    }
    else if (action == PutMark)  /* put a marker on the stack */
    {
      if (nummsg == errmsgsiz)
      {
        tmpbuff = txtbuff[0];  /* buffers full; reuse oldest buffer */
        *txtbuff[0] = '\0';  /* clear the buffer for this msg */

        nummsg--;
        for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1];   /* shift remaining pointers */

        txtbuff[nummsg] = tmpbuff;  /* set pointer for the new message */
      }
      else
      {
        for (ii = 0; ii < errmsgsiz; ii++)
        {
          if (*errbuff[ii] == '\0') /* find first empty buffer */
          {
            txtbuff[nummsg] = errbuff[ii];
            break;
          }
        }
      }

      *txtbuff[nummsg] = ESMARKER;      /* write the marker */
      *(txtbuff[nummsg] + 1) = '\0';
      nummsg++;

    }

    FFUNLOCK;
    return;
}